

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

void Ree_ManCutPrint(int *pCut,int Count,word Truth,int iObj)

{
  int local_28;
  int c;
  int iObj_local;
  word Truth_local;
  int *piStack_10;
  int Count_local;
  int *pCut_local;
  
  _c = Truth;
  Truth_local._4_4_ = Count;
  piStack_10 = pCut;
  printf("%d : %d : ",(ulong)(uint)Count,(ulong)(uint)iObj);
  for (local_28 = 1; local_28 <= *piStack_10; local_28 = local_28 + 1) {
    printf("%3d ",(ulong)(uint)piStack_10[local_28]);
  }
  for (; local_28 < 5; local_28 = local_28 + 1) {
    printf("    ");
  }
  printf("0x");
  Abc_TtPrintHexRev(_stdout,(word *)&c,3);
  printf("\n");
  return;
}

Assistant:

void Ree_ManCutPrint( int * pCut, int Count, word Truth, int iObj )
{
    int c;
    printf( "%d : %d : ", Count, iObj );
    for ( c = 1; c <= pCut[0]; c++ )
        printf( "%3d ", pCut[c] );
    for (      ; c <= 4; c++ )
        printf( "    " );
    printf( "0x" );
    Abc_TtPrintHexRev( stdout, &Truth, 3 );
    printf( "\n" );
}